

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O3

char xSAT_SolverSearch(xSAT_Solver_t *s)

{
  iword *piVar1;
  xSAT_Watcher_t *pxVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  xSAT_BQueue_t *pxVar6;
  xSAT_Heap_t *h;
  xSAT_BQueue_t *pxVar7;
  Vec_Int_t *pVVar8;
  uint *puVar9;
  int *piVar10;
  int *piVar11;
  xSAT_VecWatchList_t *pxVar12;
  bool bVar13;
  int t;
  uint uVar14;
  int iVar15;
  long lVar16;
  Vec_Int_t *pVVar17;
  ulong uVar18;
  int *piVar19;
  int t_1;
  uint *puVar20;
  char *pcVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  xSAT_Watcher_t *pxVar26;
  char *__file;
  uint uVar27;
  char *__assertion;
  uint uVar28;
  long lVar29;
  word wVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  int iVar34;
  
  (s->Stats).nStarts = (s->Stats).nStarts + 1;
LAB_00905cce:
  uVar14 = xSAT_SolverPropagate(s);
  if (uVar14 == 0xffffffff) {
    pxVar6 = s->bqLBD;
    if ((pxVar6->nCap == pxVar6->nSize) &&
       ((double)(s->nSumLBD / (float)(s->Stats).nConflicts) <
        (double)(pxVar6->nSum / (ulong)(long)pxVar6->nSize & 0xffffffff) * (s->Config).K)) {
      pxVar6->nSize = 0;
      pxVar6->iFirst = 0;
      pxVar6->iEmpty = 0;
      pxVar6->nSum = 0;
      xSAT_SolverCancelUntil(s,0);
      return '\0';
    }
    if (s->vTrailLim->nSize == 0) {
      xSAT_SolverSimplify(s);
    }
    lVar16 = (s->Stats).nConflicts;
    if (s->nConfBeforeReduce <= lVar16) {
      s->nRC1 = lVar16 / (long)s->nRC2 + 1;
      xSAT_SolverReduceDB(s);
      iVar22 = s->nRC2 + (s->Config).nIncReduce;
      s->nRC2 = iVar22;
      s->nConfBeforeReduce = iVar22 * (int)s->nRC1;
    }
    uVar32 = 0xffffffff;
LAB_00905dfe:
    iVar22 = (int)uVar32;
    if (iVar22 != -1) {
      if (s->vAssigns->nSize <= iVar22) goto LAB_00906c48;
      if (s->vAssigns->pArray[uVar32] == '\x03') goto LAB_00906bce;
    }
    h = s->hOrder;
    pVVar17 = h->vHeap;
    uVar14 = pVVar17->nSize;
    if ((ulong)uVar14 == 0) {
      return '\x01';
    }
    if ((int)uVar14 < 1) goto LAB_00906c67;
    puVar20 = (uint *)pVVar17->pArray;
    uVar25 = *puVar20;
    uVar32 = (ulong)uVar25;
    uVar14 = puVar20[(ulong)uVar14 - 1];
    *puVar20 = uVar14;
    if (pVVar17->nSize < 1) goto LAB_00906c67;
    if (((int)uVar14 < 0) || (pVVar8 = h->vIndices, pVVar8->nSize <= (int)uVar14))
    goto LAB_00906ca5;
    piVar19 = pVVar8->pArray;
    piVar19[uVar14] = 0;
    if (((int)uVar25 < 0) || (pVVar8->nSize <= (int)uVar25)) goto LAB_00906ca5;
    piVar19[uVar32] = -1;
    if (pVVar17->nSize < 1) {
LAB_00906cc4:
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
    }
    uVar14 = pVVar17->nSize - 1;
    pVVar17->nSize = uVar14;
    if (1 < uVar14) {
      xSAT_HeapPercolateDown(h,0);
    }
    goto LAB_00905dfe;
  }
  pVVar17 = s->vTrailLim;
  lVar16 = (s->Stats).nConflicts;
  (s->Stats).nConflicts = lVar16 + 1;
  if (pVVar17->nSize == 0) {
    return -1;
  }
  pVVar17 = s->vTrail;
  pxVar6 = s->bqTrail;
  uVar25 = pVVar17->nSize;
  iVar22 = pxVar6->nSize;
  if (iVar22 == pxVar6->nCap) {
    iVar34 = pxVar6->iFirst;
    lVar29 = (long)iVar34;
    if (iVar34 != pxVar6->iEmpty) goto LAB_00906d79;
    puVar20 = pxVar6->pData;
    wVar30 = pxVar6->nSum - (ulong)puVar20[lVar29];
    pxVar6->iFirst = (iVar34 + 1) % iVar22;
  }
  else {
    pxVar6->nSize = iVar22 + 1;
    wVar30 = pxVar6->nSum;
    puVar20 = pxVar6->pData;
    lVar29 = (long)pxVar6->iEmpty;
  }
  uVar32 = uVar25 + wVar30;
  pxVar6->nSum = uVar32;
  puVar20[lVar29] = uVar25;
  iVar22 = pxVar6->iEmpty + 1;
  pxVar6->iEmpty = iVar22;
  if (iVar22 == pxVar6->nCap) {
    pxVar6->iFirst = 0;
    pxVar6->iEmpty = 0;
  }
  if ((((s->Config).nFirstBlockRestart <= lVar16) &&
      (pxVar7 = s->bqLBD, pxVar7->nCap == pxVar7->nSize)) &&
     ((double)(uVar32 / (ulong)(long)pxVar6->nSize & 0xffffffff) * (s->Config).R <
      (double)pVVar17->nSize)) {
    pxVar7->nSize = 0;
    pxVar7->iFirst = 0;
    pxVar7->iEmpty = 0;
    pxVar7->nSum = 0;
    pVVar17 = s->vTrail;
  }
  pVVar8 = s->vLearntClause;
  pVVar8->nSize = 0;
  piVar19 = pVVar17->pArray;
  iVar34 = pVVar17->nSize + -1;
  uVar25 = 0xfffffffe;
  Vec_IntPush(pVVar8,-2);
  iVar22 = 0;
  do {
    if (uVar14 == 0xffffffff) {
      __assert_fail("ConfCRef != CRefUndef",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                    ,0x22d,
                    "void xSAT_SolverAnalyze(xSAT_Solver_t *, unsigned int, Vec_Int_t *, int *, unsigned int *)"
                   );
    }
    puVar20 = s->pMemory->pData + (int)uVar14;
    if ((uVar25 != 0xfffffffe) && (puVar20[1] == 2)) {
      uVar14 = puVar20[2];
      uVar24 = (int)uVar14 >> 1;
      if ((int)uVar24 < 0) goto LAB_00906c48;
      uVar23 = s->vAssigns->nSize;
      if ((int)uVar23 <= (int)uVar24) goto LAB_00906c48;
      pcVar21 = s->vAssigns->pArray;
      if ((uVar14 & 1 ^ (int)pcVar21[uVar24]) == 1) {
        uVar24 = puVar20[3];
        uVar27 = (int)uVar24 >> 1;
        if (((int)uVar27 < 0) || (uVar23 <= uVar27)) goto LAB_00906c48;
        if ((uVar24 & 1) != (int)pcVar21[uVar27]) {
          __assert_fail("Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lits[1] ) ) == xSAT_LitSign( ( Lits[1] ) )"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                        ,0x233,
                        "void xSAT_SolverAnalyze(xSAT_Solver_t *, unsigned int, Vec_Int_t *, int *, unsigned int *)"
                       );
        }
        puVar20[2] = uVar24;
        puVar20[3] = uVar14;
      }
    }
    if (((*puVar20 & 1) != 0) &&
       (puVar20[(long)(int)puVar20[1] + 2] = puVar20[(long)(int)puVar20[1] + 2] + s->nClaActInc,
       (int)puVar20[(long)(int)puVar20[1] + 2] < 0)) {
      pVVar17 = s->vLearnts;
      if (0 < pVVar17->nSize) {
        lVar16 = 0;
        do {
          puVar9 = s->pMemory->pData;
          puVar9 = puVar9 + (long)pVVar17->pArray[lVar16] +
                            (long)(int)puVar9[(long)pVVar17->pArray[lVar16] + 1] + 2;
          *puVar9 = *puVar9 >> 0xe;
          lVar16 = lVar16 + 1;
          pVVar17 = s->vLearnts;
        } while (lVar16 < pVVar17->nSize);
      }
      iVar15 = s->nClaActInc >> 0xe;
      if (iVar15 < 0x401) {
        iVar15 = 0x400;
      }
      s->nClaActInc = iVar15;
    }
    if ((0x2f < *puVar20 & (byte)*puVar20) == 0) {
      uVar14 = puVar20[1];
    }
    else {
      s->nStamp = s->nStamp + 1;
      uVar14 = puVar20[1];
      if ((int)uVar14 < 1) {
        iVar15 = 0;
      }
      else {
        pVVar17 = s->vLevels;
        lVar16 = 0;
        iVar15 = 0;
        do {
          uVar24 = (int)puVar20[lVar16 + 2] >> 1;
          if (((int)uVar24 < 0) || (pVVar17->nSize <= (int)uVar24)) goto LAB_00906c67;
          iVar4 = pVVar17->pArray[uVar24];
          lVar29 = (long)iVar4;
          if ((lVar29 < 0) || (s->vStamp->nSize <= iVar4)) goto LAB_00906c67;
          piVar10 = s->vStamp->pArray;
          if (piVar10[lVar29] != s->nStamp) {
            piVar10[lVar29] = s->nStamp;
            iVar15 = iVar15 + 1;
            uVar14 = puVar20[1];
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < (int)uVar14);
      }
      uVar24 = *puVar20;
      if (iVar15 + 1U < uVar24 >> 4) {
        uVar23 = uVar24 & 7;
        if ((s->Config).nLBDFrozenClause < uVar24 >> 4) {
          uVar23 = uVar24;
        }
        *puVar20 = uVar23 & 0xf | iVar15 << 4;
      }
    }
    if ((int)(uint)(uVar25 != 0xfffffffe) < (int)uVar14) {
      uVar32 = (ulong)(uVar25 != 0xfffffffe);
      do {
        uVar14 = (int)puVar20[uVar32 + 2] >> 1;
        if (((int)uVar14 < 0) || (s->vSeen->nSize <= (int)uVar14)) goto LAB_00906c48;
        pcVar21 = s->vSeen->pArray;
        if (pcVar21[uVar14] == '\0') {
          if (s->vLevels->nSize <= (int)uVar14) goto LAB_00906c67;
          if (0 < s->vLevels->pArray[uVar14]) {
            pcVar21[uVar14] = '\x01';
            pVVar17 = s->vActivity;
            piVar11 = pVVar17->pArray;
            piVar10 = piVar11 + uVar14;
            *piVar10 = *piVar10 + s->nVarActInc;
            if (*piVar10 < 0) {
              if (0 < pVVar17->nSize) {
                lVar16 = 0;
                do {
                  puVar9 = (uint *)(piVar11 + lVar16);
                  *puVar9 = *puVar9 >> 0x13;
                  lVar16 = lVar16 + 1;
                } while (lVar16 < pVVar17->nSize);
              }
              iVar15 = s->nVarActInc >> 0x13;
              if (iVar15 < 0x21) {
                iVar15 = 0x20;
              }
              s->nVarActInc = iVar15;
            }
            pVVar17 = s->hOrder->vIndices;
            if (((int)uVar14 < pVVar17->nSize) && (iVar15 = pVVar17->pArray[uVar14], -1 < iVar15)) {
              xSAT_HeapPercolateUp(s->hOrder,iVar15);
            }
            if (s->vLevels->nSize <= (int)uVar14) goto LAB_00906c67;
            if (s->vLevels->pArray[uVar14] < s->vTrailLim->nSize) {
              uVar14 = puVar20[uVar32 + 2];
              pVVar17 = pVVar8;
            }
            else {
              if (s->vReasons->nSize <= (int)uVar14) goto LAB_00906c67;
              iVar22 = iVar22 + 1;
              lVar16 = (long)s->vReasons->pArray[uVar14];
              if ((lVar16 == -1) || ((s->pMemory->pData[lVar16] & 1) == 0)) goto LAB_00906162;
              pVVar17 = s->vLastDLevel;
            }
            Vec_IntPush(pVVar17,uVar14);
          }
        }
LAB_00906162:
        uVar32 = uVar32 + 1;
      } while ((int)uVar32 < (int)puVar20[1]);
    }
    puVar20 = (uint *)(piVar19 + iVar34);
    do {
      uVar25 = *puVar20;
      uVar24 = (int)uVar25 >> 1;
      if (((int)uVar24 < 0) || (s->vSeen->nSize <= (int)uVar24)) goto LAB_00906c48;
      pcVar21 = s->vSeen->pArray;
      puVar20 = puVar20 + -1;
      iVar34 = iVar34 + -1;
    } while (pcVar21[uVar24] == '\0');
    if (s->vReasons->nSize <= (int)uVar24) goto LAB_00906c67;
    uVar14 = s->vReasons->pArray[uVar24];
    pcVar21[uVar24] = '\0';
    bVar13 = 1 < iVar22;
    iVar22 = iVar22 + -1;
  } while (bVar13);
  puVar20 = (uint *)pVVar8->pArray;
  *puVar20 = uVar25 ^ 1;
  iVar22 = pVVar8->nSize;
  uVar14 = 0;
  if (1 < (long)iVar22) {
    uVar14 = 0;
    lVar16 = 1;
    do {
      uVar25 = (int)puVar20[lVar16] >> 1;
      if (((int)uVar25 < 0) || (s->vLevels->nSize <= (int)uVar25)) goto LAB_00906c67;
      uVar14 = uVar14 | 1 << (*(byte *)(s->vLevels->pArray + uVar25) & 0x1f);
      lVar16 = lVar16 + 1;
    } while (iVar22 != lVar16);
  }
  if (iVar22 < 1) goto LAB_00906d1c;
  pVVar17 = s->vTagged;
  lVar16 = 0;
  do {
    Vec_IntPush(pVVar17,pVVar8->pArray[lVar16]);
    lVar16 = lVar16 + 1;
    iVar22 = pVVar8->nSize;
  } while (lVar16 < iVar22);
  if (1 < iVar22) {
    uVar32 = 1;
    lVar16 = 1;
LAB_00906379:
    uVar25 = puVar20[lVar16];
    uVar24 = (int)uVar25 >> 1;
    if ((-1 < (int)uVar24) && ((int)uVar24 < s->vReasons->nSize)) {
      if (s->vReasons->pArray[uVar24] == -1) goto LAB_00906654;
      pVVar17 = s->vStack;
      uVar25 = s->vTagged->nSize;
      uVar18 = (ulong)uVar25;
      pVVar17->nSize = 0;
      Vec_IntPush(pVVar17,uVar24);
      pVVar17 = s->vStack;
      iVar22 = pVVar17->nSize;
      while (iVar22 != 0) {
        if (iVar22 < 1) goto LAB_00906cc4;
        pVVar17->nSize = iVar22 - 1U;
        iVar22 = pVVar17->pArray[iVar22 - 1U];
        if (((long)iVar22 < 0) || (s->vReasons->nSize <= iVar22)) goto LAB_00906c67;
        lVar29 = (long)s->vReasons->pArray[iVar22];
        if (lVar29 == -1) {
          __assertion = "(unsigned) Vec_IntEntry( s->vReasons, v ) != CRefUndef";
          __file = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
          ;
          pcVar21 = "int xSAT_SolverIsLitRemovable(xSAT_Solver_t *, int, int)";
          goto LAB_00906c7c;
        }
        puVar9 = s->pMemory->pData;
        uVar24 = puVar9[lVar29 + 1];
        if (uVar24 == 2) {
          uVar23 = puVar9[lVar29 + 2];
          uVar27 = (int)uVar23 >> 1;
          if ((int)uVar27 < 0) goto LAB_00906c48;
          uVar5 = s->vAssigns->nSize;
          if ((int)uVar5 <= (int)uVar27) goto LAB_00906c48;
          pcVar21 = s->vAssigns->pArray;
          if ((uVar23 & 1 ^ (int)pcVar21[uVar27]) == 1) {
            uVar27 = puVar9[lVar29 + 3];
            uVar28 = (int)uVar27 >> 1;
            if (((int)uVar28 < 0) || (uVar5 <= uVar28)) goto LAB_00906c48;
            if ((uVar27 & 1) != (int)pcVar21[uVar28]) {
              __assert_fail("Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lits[1] ) ) == xSAT_LitSign( ( Lits[1] ) )"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                            ,0x1ac,"int xSAT_SolverIsLitRemovable(xSAT_Solver_t *, int, int)");
            }
            puVar9[lVar29 + 2] = uVar27;
            puVar9[lVar29 + 3] = uVar23;
          }
LAB_009064ac:
          lVar33 = 1;
          do {
            uVar23 = (int)puVar9[lVar29 + lVar33 + 2] >> 1;
            if (((int)uVar23 < 0) || (s->vSeen->nSize <= (int)uVar23)) goto LAB_00906c48;
            if (s->vSeen->pArray[uVar23] == '\0') {
              if (s->vLevels->nSize <= (int)uVar23) goto LAB_00906c67;
              uVar27 = s->vLevels->pArray[uVar23];
              if (uVar27 != 0) {
                if (s->vReasons->nSize <= (int)uVar23) goto LAB_00906c67;
                if ((s->vReasons->pArray[uVar23] == -1) || ((uVar14 >> (uVar27 & 0x1f) & 1) == 0)) {
                  pVVar17 = s->vTagged;
                  iVar22 = pVVar17->nSize;
                  if (iVar22 <= (int)uVar25) goto LAB_0090663f;
                  if (-1 < (int)uVar25) goto LAB_009065ef;
                  goto LAB_00906c67;
                }
                Vec_IntPush(s->vStack,uVar23);
                Vec_IntPush(s->vTagged,puVar9[lVar29 + lVar33 + 2]);
                if (s->vSeen->nSize <= (int)uVar23) goto LAB_00906c86;
                s->vSeen->pArray[uVar23] = '\x01';
                uVar24 = puVar9[lVar29 + 1];
              }
            }
            lVar33 = lVar33 + 1;
          } while (lVar33 < (int)uVar24);
          pVVar17 = s->vStack;
        }
        else if (1 < (int)uVar24) goto LAB_009064ac;
        iVar22 = pVVar17->nSize;
      }
      goto LAB_0090665f;
    }
    goto LAB_00906c67;
  }
  if (iVar22 != 1) goto LAB_00906d1c;
  s->nStamp = s->nStamp + 1;
  uVar32 = 1;
  goto LAB_009066ad;
LAB_00906bce:
  if (s->vPolarity->nSize <= iVar22) {
LAB_00906c48:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  cVar3 = s->vPolarity->pArray[uVar32];
  piVar1 = &(s->Stats).nDecisions;
  *piVar1 = *piVar1 + 1;
  Vec_IntPush(s->vTrailLim,s->vTrail->nSize);
  xSAT_SolverEnqueue(s,(uint)(cVar3 != '\0') + iVar22 * 2,0xffffffff);
  goto LAB_00905cce;
  while( true ) {
    s->vSeen->pArray[uVar24] = '\0';
    uVar18 = uVar18 + 1;
    pVVar17 = s->vTagged;
    iVar22 = pVVar17->nSize;
    if (iVar22 <= (int)uVar18) break;
LAB_009065ef:
    uVar24 = pVVar17->pArray[uVar18] >> 1;
    if (((int)uVar24 < 0) || (s->vSeen->nSize <= (int)uVar24)) goto LAB_00906c86;
  }
LAB_0090663f:
  if (iVar22 < (int)uVar25) goto LAB_00906d1c;
  pVVar17->nSize = uVar25;
  uVar25 = puVar20[lVar16];
LAB_00906654:
  iVar22 = (int)uVar32;
  uVar32 = (ulong)(iVar22 + 1);
  puVar20[iVar22] = uVar25;
LAB_0090665f:
  lVar16 = lVar16 + 1;
  if (pVVar8->nSize <= lVar16) goto code_r0x00906670;
  goto LAB_00906379;
code_r0x00906670:
  iVar22 = (int)uVar32;
  if (pVVar8->nSize < iVar22) {
LAB_00906d1c:
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  pVVar8->nSize = iVar22;
  if (iVar22 < 0x1f) {
    s->nStamp = s->nStamp + 1;
    if (iVar22 < 1) {
LAB_00906722:
      uVar18 = (long)(int)*puVar20 ^ 1;
      pxVar12 = s->vBinWatches;
      if (pxVar12->nCap <= (int)uVar18) {
        __assert_fail("iEntry < v->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatWatchList.h"
                      ,0x106,"xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)")
        ;
      }
      if (pxVar12->nSize <= (int)uVar18) {
        __assert_fail("iEntry < v->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatWatchList.h"
                      ,0x107,"xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)")
        ;
      }
      pxVar26 = pxVar12->pArray[uVar18].pArray;
      iVar22 = pxVar12->pArray[uVar18].nSize;
      s->nStamp = s->nStamp + 1;
      if (0 < (int)uVar32) {
        piVar19 = pVVar8->pArray;
        pVVar17 = s->vStamp;
        lVar16 = 0;
        do {
          uVar14 = piVar19[lVar16] >> 1;
          if (((int)uVar14 < 0) || (pVVar17->nSize <= (int)uVar14)) {
LAB_00906ca5:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar17->pArray[uVar14] = s->nStamp;
          lVar16 = lVar16 + 1;
          uVar32 = (ulong)pVVar8->nSize;
        } while (lVar16 < (long)uVar32);
      }
      if (0 < iVar22) {
        pxVar2 = pxVar26 + iVar22;
        pVVar17 = s->vStamp;
        iVar22 = 0;
        do {
          uVar14 = pxVar26->Blocker >> 1;
          if (((int)uVar14 < 0) || (pVVar17->nSize <= (int)uVar14)) goto LAB_00906c67;
          piVar19 = pVVar17->pArray;
          if (piVar19[uVar14] == s->nStamp) {
            if (s->vAssigns->nSize <= (int)uVar14) goto LAB_00906c48;
            if ((pxVar26->Blocker & 1U) == (int)s->vAssigns->pArray[uVar14]) {
              iVar22 = iVar22 + 1;
              piVar19[uVar14] = piVar19[uVar14] - 1;
            }
          }
          pxVar26 = pxVar26 + 1;
        } while (pxVar26 < pxVar2);
        uVar14 = pVVar8->nSize;
        uVar32 = (ulong)uVar14;
        if (0 < iVar22) {
          uVar25 = uVar14 - iVar22;
          if (1 < (int)uVar25) {
            iVar34 = uVar14 - 1;
            iVar15 = 1;
            do {
              uVar14 = (int)puVar20[iVar15] >> 1;
              if (((int)uVar14 < 0) || (pVVar17->nSize <= (int)uVar14)) goto LAB_00906c67;
              if (piVar19[uVar14] != s->nStamp) {
                uVar14 = puVar20[iVar34];
                puVar20[iVar34] = puVar20[iVar15];
                puVar20[iVar15] = uVar14;
                iVar15 = iVar15 + -1;
                iVar34 = iVar34 + -1;
                uVar32 = (ulong)(uint)pVVar8->nSize;
              }
              iVar15 = iVar15 + 1;
              uVar25 = (int)uVar32 - iVar22;
            } while (iVar15 < (int)uVar25);
          }
          pVVar8->nSize = uVar25;
          uVar32 = (ulong)uVar25;
        }
      }
    }
    else {
LAB_009066ad:
      pVVar17 = s->vLevels;
      piVar19 = pVVar8->pArray;
      lVar16 = 0;
      iVar22 = 0;
      do {
        uVar14 = piVar19[lVar16] >> 1;
        if (((int)uVar14 < 0) || (pVVar17->nSize <= (int)uVar14)) goto LAB_00906c67;
        iVar34 = pVVar17->pArray[uVar14];
        lVar29 = (long)iVar34;
        if ((lVar29 < 0) || (s->vStamp->nSize <= iVar34)) goto LAB_00906c67;
        piVar10 = s->vStamp->pArray;
        if (piVar10[lVar29] != s->nStamp) {
          piVar10[lVar29] = s->nStamp;
          iVar22 = iVar22 + 1;
          uVar32 = (ulong)(uint)pVVar8->nSize;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (int)uVar32);
      if (iVar22 < 7) goto LAB_00906722;
    }
    piVar19 = pVVar8->pArray;
    iVar22 = 0;
    if ((int)uVar32 != 1) goto LAB_009068ac;
  }
  else {
    piVar19 = pVVar8->pArray;
LAB_009068ac:
    iVar22 = piVar19[1];
    uVar14 = iVar22 >> 1;
    if ((int)uVar14 < 0) goto LAB_00906c67;
    pVVar17 = s->vLevels;
    if (pVVar17->nSize <= (int)uVar14) goto LAB_00906c67;
    piVar10 = pVVar17->pArray;
    lVar16 = 1;
    if (2 < (int)uVar32) {
      iVar34 = piVar10[uVar14];
      uVar18 = 1;
      uVar31 = 2;
      do {
        uVar14 = piVar19[uVar31] >> 1;
        if (((int)uVar14 < 0) || ((uint)pVVar17->nSize <= uVar14)) goto LAB_00906c67;
        if (iVar34 < piVar10[uVar14]) {
          uVar18 = uVar31 & 0xffffffff;
          iVar34 = piVar10[uVar14];
        }
        uVar31 = uVar31 + 1;
      } while ((uVar32 & 0xffffffff) != uVar31);
      lVar16 = (long)(int)uVar18;
    }
    piVar19[1] = piVar19[lVar16];
    piVar19[lVar16] = iVar22;
    uVar14 = piVar19[1] >> 1;
    if (((int)uVar14 < 0) || (pVVar17->nSize <= (int)uVar14)) goto LAB_00906c67;
    iVar22 = piVar10[uVar14];
    uVar32 = (ulong)(uint)pVVar8->nSize;
  }
  s->nStamp = s->nStamp + 1;
  if ((int)uVar32 < 1) {
    uVar14 = 0;
  }
  else {
    pVVar17 = s->vLevels;
    lVar16 = 0;
    uVar14 = 0;
    do {
      uVar25 = piVar19[lVar16] >> 1;
      if (((int)uVar25 < 0) || (pVVar17->nSize <= (int)uVar25)) goto LAB_00906c67;
      iVar34 = pVVar17->pArray[uVar25];
      lVar29 = (long)iVar34;
      if ((lVar29 < 0) || (s->vStamp->nSize <= iVar34)) goto LAB_00906c67;
      piVar10 = s->vStamp->pArray;
      if (piVar10[lVar29] != s->nStamp) {
        piVar10[lVar29] = s->nStamp;
        uVar14 = uVar14 + 1;
        uVar32 = (ulong)(uint)pVVar8->nSize;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (int)uVar32);
  }
  pVVar17 = s->vLastDLevel;
  if (0 < pVVar17->nSize) {
    lVar16 = 0;
    do {
      iVar34 = pVVar17->pArray[lVar16];
      lVar29 = (long)iVar34;
      if ((lVar29 < 0) || (s->vReasons->nSize <= iVar34)) goto LAB_00906c67;
      if (s->pMemory->pData[s->vReasons->pArray[lVar29]] >> 4 < uVar14) {
        pVVar8 = s->vActivity;
        piVar10 = pVVar8->pArray;
        piVar19 = piVar10 + lVar29;
        *piVar19 = *piVar19 + s->nVarActInc;
        if (*piVar19 < 0) {
          if (0 < pVVar8->nSize) {
            lVar33 = 0;
            do {
              puVar20 = (uint *)(piVar10 + lVar33);
              *puVar20 = *puVar20 >> 0x13;
              lVar33 = lVar33 + 1;
            } while (lVar33 < pVVar8->nSize);
          }
          iVar15 = s->nVarActInc >> 0x13;
          if (iVar15 < 0x21) {
            iVar15 = 0x20;
          }
          s->nVarActInc = iVar15;
        }
        pVVar8 = s->hOrder->vIndices;
        if ((iVar34 < pVVar8->nSize) && (iVar34 = pVVar8->pArray[lVar29], -1 < iVar34)) {
          xSAT_HeapPercolateUp(s->hOrder,iVar34);
          pVVar17 = s->vLastDLevel;
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar17->nSize);
    pVVar17->nSize = 0;
  }
  pVVar17 = s->vTagged;
  if (0 < pVVar17->nSize) {
    lVar16 = 0;
    do {
      uVar25 = pVVar17->pArray[lVar16] >> 1;
      if (((int)uVar25 < 0) || (s->vSeen->nSize <= (int)uVar25)) {
LAB_00906c86:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      s->vSeen->pArray[uVar25] = '\0';
      lVar16 = lVar16 + 1;
      pVVar17 = s->vTagged;
    } while (lVar16 < pVVar17->nSize);
  }
  pVVar17->nSize = 0;
  s->nSumLBD = (float)uVar14 + s->nSumLBD;
  pxVar6 = s->bqLBD;
  iVar34 = pxVar6->nSize;
  if (iVar34 == pxVar6->nCap) {
    iVar15 = pxVar6->iFirst;
    lVar16 = (long)iVar15;
    if (iVar15 != pxVar6->iEmpty) {
LAB_00906d79:
      __assert_fail("p->iFirst == p->iEmpty",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatBQueue.h"
                    ,99,"void xSAT_BQueuePush(xSAT_BQueue_t *, unsigned int)");
    }
    puVar20 = pxVar6->pData;
    wVar30 = pxVar6->nSum - (ulong)puVar20[lVar16];
    pxVar6->iFirst = (iVar15 + 1) % iVar34;
  }
  else {
    pxVar6->nSize = iVar34 + 1;
    wVar30 = pxVar6->nSum;
    puVar20 = pxVar6->pData;
    lVar16 = (long)pxVar6->iEmpty;
  }
  pxVar6->nSum = uVar14 + wVar30;
  puVar20[lVar16] = uVar14;
  iVar34 = pxVar6->iEmpty + 1;
  pxVar6->iEmpty = iVar34;
  if (iVar34 == pxVar6->nCap) {
    pxVar6->iFirst = 0;
    pxVar6->iEmpty = 0;
  }
  xSAT_SolverCancelUntil(s,iVar22);
  pVVar17 = s->vLearntClause;
  uVar14 = 0xffffffff;
  if (pVVar17->nSize != 1) {
    uVar14 = xSAT_SolverClaNew(s,pVVar17,1);
    pVVar17 = s->vLearntClause;
    if (pVVar17->nSize < 1) {
LAB_00906c67:
      __assertion = "i >= 0 && i < p->nSize";
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
      ;
      pcVar21 = "int Vec_IntEntry(Vec_Int_t *, int)";
LAB_00906c7c:
      __assert_fail(__assertion,__file,0x1a9,pcVar21);
    }
  }
  xSAT_SolverEnqueue(s,*pVVar17->pArray,uVar14);
  s->nVarActInc = (s->nVarActInc >> 4) + s->nVarActInc;
  s->nClaActInc = (s->nClaActInc >> 10) + s->nClaActInc;
  goto LAB_00905cce;
}

Assistant:

char xSAT_SolverSearch( xSAT_Solver_t * s )
{
    iword conflictC  = 0;

    s->Stats.nStarts++;
    for (;;)
    {
        unsigned hConfl = xSAT_SolverPropagate( s );

        if ( hConfl != CRefUndef )
        {
            /* Conflict */
            int BacktrackLevel;
            unsigned nLBD;
            unsigned CRef;

            s->Stats.nConflicts++;
            conflictC++;

            if ( xSAT_SolverDecisionLevel( s ) == 0 )
                return LBoolFalse;

            xSAT_BQueuePush( s->bqTrail, Vec_IntSize( s->vTrail ) );
            if ( s->Stats.nConflicts > s->Config.nFirstBlockRestart && xSAT_BQueueIsValid( s->bqLBD ) && ( Vec_IntSize( s->vTrail ) > ( s->Config.R * ( iword ) xSAT_BQueueAvg( s->bqTrail ) ) ) )
                xSAT_BQueueClean(s->bqLBD);

            Vec_IntClear( s->vLearntClause );
            xSAT_SolverAnalyze( s, hConfl, s->vLearntClause, &BacktrackLevel, &nLBD );

            s->nSumLBD += nLBD;
            xSAT_BQueuePush( s->bqLBD, nLBD );
            xSAT_SolverCancelUntil( s, BacktrackLevel );

            CRef = Vec_IntSize( s->vLearntClause ) == 1 ? CRefUndef : xSAT_SolverClaNew( s, s->vLearntClause , 1 );
            xSAT_SolverEnqueue( s, Vec_IntEntry( s->vLearntClause , 0 ), CRef );

            xSAT_SolverVarActDecay( s );
            xSAT_SolverClaActDecay( s );
        }
        else
        {
            /* No conflict */
            int NextVar;
            if ( xSAT_BQueueIsValid( s->bqLBD ) && ( ( ( iword )xSAT_BQueueAvg( s->bqLBD ) * s->Config.K ) > ( s->nSumLBD / s->Stats.nConflicts ) ) )
            {
                xSAT_BQueueClean( s->bqLBD );
                xSAT_SolverCancelUntil( s, 0 );
                return LBoolUndef;
            }

            // Simplify the set of problem clauses:
            if ( xSAT_SolverDecisionLevel( s ) == 0 )
                xSAT_SolverSimplify( s );

            // Reduce the set of learnt clauses:
            if ( s->Stats.nConflicts >= s->nConfBeforeReduce )
            {
                s->nRC1 = ( s->Stats.nConflicts / s->nRC2 ) + 1;
                xSAT_SolverReduceDB(s);
                s->nRC2 += s->Config.nIncReduce;
                s->nConfBeforeReduce = s->nRC1 * s->nRC2;
            }

            // New variable decision:
            NextVar = xSAT_SolverDecide( s );

            if ( NextVar == VarUndef )
                return LBoolTrue;

            xSAT_SolverNewDecision( s, xSAT_Var2Lit( NextVar, ( int ) Vec_StrEntry( s->vPolarity, NextVar ) ) );
        }
    }

    return LBoolUndef; // cannot happen
}